

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::Test<float,3,true>
          (BufferTest *this,bool use_range_version)

{
  bool bVar1;
  
  bVar1 = PrepareFramebuffer(this,0x8815);
  if (bVar1) {
    bVar1 = CreateBufferTexture<float,3,true>(this,use_range_version);
    if (bVar1) {
      Draw(this);
      bVar1 = Check<float,3,true>(this);
      CleanFramebuffer(this);
      CleanBufferTexture(this);
    }
    else {
      CleanFramebuffer(this);
      bVar1 = false;
    }
  }
  else {
    CleanFramebuffer(this);
    bVar1 = true;
  }
  CleanErrors(this);
  return bVar1;
}

Assistant:

bool BufferTest::Test(bool use_range_version)
{
	/* Setup. */
	if (!PrepareFramebuffer(InternalFormat<T, S, N>()))
	{
		/**
                 * If the framebuffer it not supported, means that the
                 * tested combination is unsupported for this driver,
                 * but allowed to be unsupported by OpenGL spec, so we
                 * just skip.
                 */
		CleanFramebuffer();
		CleanErrors();

		return true;
	}

	if (!CreateBufferTexture<T, S, N>(use_range_version))
	{
		CleanFramebuffer();
		CleanErrors();

		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N>();

	/* Cleanup. */
	CleanFramebuffer();
	CleanBufferTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}